

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O0

void write_inter_txb_coeff
               (AV1_COMMON *cm,MACROBLOCK *x,MB_MODE_INFO *mbmi,aom_writer *w,TokenExtra **tok,
               TokenExtra *tok_end,TOKEN_STATS *token_stats,int row,int col,int *block,int plane)

{
  int subsampling_y;
  int iVar1;
  int iVar2;
  int iVar3;
  BLOCK_SIZE BVar4;
  byte bVar5;
  BLOCK_SIZE BVar6;
  int iVar7;
  TokenExtra **tp;
  TokenExtra *tok_end_00;
  aom_writer *in_RCX;
  BLOCK_SIZE *in_RDX;
  undefined8 unaff_RBP;
  long in_RSI;
  AV1_COMMON *in_R8;
  MACROBLOCK *in_R9;
  MB_MODE_INFO *unaff_R15;
  BLOCK_SIZE unaff_retaddr;
  aom_bit_depth_t in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  int in_stack_00000020;
  undefined4 in_stack_00000024;
  TX_SIZE TStack0000000000000028;
  TOKEN_STATS *in_stack_00000030;
  int blk_col;
  int blk_row;
  int unit_width;
  int unit_height;
  int mu_blocks_high;
  int mu_blocks_wide;
  int num_4x4_h;
  int num_4x4_w;
  BLOCK_SIZE max_unit_bsize;
  int bkh;
  int bkw;
  int step;
  TX_SIZE max_tx_size;
  BLOCK_SIZE plane_bsize;
  int ss_y;
  int ss_x;
  BLOCK_SIZE bsize;
  macroblockd_plane *pd;
  MACROBLOCKD *xd;
  int in_stack_ffffffffffffff00;
  BLOCK_SIZE in_stack_ffffffffffffff07;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  uint local_b8;
  uint local_b4;
  int local_b0;
  int local_ac;
  int subsampling_x;
  undefined3 in_stack_ffffffffffffff8c;
  undefined4 uVar8;
  
  tp = (TokenExtra **)(in_RSI + 0x1a0);
  tok_end_00 = (TokenExtra *)(in_RSI + 0x1b0 + (long)_TStack0000000000000028 * 0xa30);
  uVar8 = CONCAT13(*in_RDX,in_stack_ffffffffffffff8c);
  subsampling_x = *(int *)(tok_end_00 + 4);
  subsampling_y = *(int *)(tok_end_00 + 8);
  BVar4 = get_plane_block_size(*in_RDX,subsampling_x,subsampling_y);
  iVar7 = get_vartx_max_txsize
                    ((MACROBLOCKD *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                     in_stack_ffffffffffffff07,in_stack_ffffffffffffff00);
  bVar5 = (byte)iVar7;
  iVar7 = tx_size_wide_unit[bVar5];
  iVar1 = tx_size_high_unit[bVar5];
  iVar2 = tx_size_wide_unit[bVar5];
  iVar3 = tx_size_high_unit[bVar5];
  BVar6 = get_plane_block_size(BLOCK_64X64,subsampling_x,subsampling_y);
  local_b8 = (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                   [BVar4];
  local_b4 = (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                   [BVar4];
  bVar5 = (byte)subsampling_y;
  if ((int)((uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                  [BVar6] + (in_stack_00000010 >> (bVar5 & 0x1f))) < (int)local_b4) {
    local_b4 = (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                     [BVar6] + (in_stack_00000010 >> (bVar5 & 0x1f));
  }
  if ((int)((uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                  [BVar6] + (in_stack_00000018 >> ((byte)subsampling_x & 0x1f))) < (int)local_b8) {
    local_b8 = (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                     [BVar6] + (in_stack_00000018 >> ((byte)subsampling_x & 0x1f));
  }
  for (local_ac = in_stack_00000010 >> (bVar5 & 0x1f); local_ac < (int)local_b4;
      local_ac = iVar3 + local_ac) {
    for (local_b0 = in_stack_00000018 >> ((byte)subsampling_x & 0x1f); local_b0 < (int)local_b8;
        local_b0 = iVar2 + local_b0) {
      pack_txb_tokens(in_RCX,in_R8,in_R9,tp,tok_end_00,(MACROBLOCKD *)CONCAT44(uVar8,subsampling_x),
                      unaff_R15,(int)unaff_RBP,unaff_retaddr,in_stack_00000008,in_stack_00000010,
                      in_stack_00000018,in_stack_00000020,TStack0000000000000028,in_stack_00000030);
      *(int *)CONCAT44(in_stack_00000024,in_stack_00000020) =
           iVar7 * iVar1 + *(int *)CONCAT44(in_stack_00000024,in_stack_00000020);
    }
  }
  return;
}

Assistant:

static inline void write_inter_txb_coeff(
    AV1_COMMON *const cm, MACROBLOCK *const x, MB_MODE_INFO *const mbmi,
    aom_writer *w, const TokenExtra **tok, const TokenExtra *const tok_end,
    TOKEN_STATS *token_stats, const int row, const int col, int *block,
    const int plane) {
  MACROBLOCKD *const xd = &x->e_mbd;
  const struct macroblockd_plane *const pd = &xd->plane[plane];
  const BLOCK_SIZE bsize = mbmi->bsize;
  assert(bsize < BLOCK_SIZES_ALL);
  const int ss_x = pd->subsampling_x;
  const int ss_y = pd->subsampling_y;
  const BLOCK_SIZE plane_bsize = get_plane_block_size(bsize, ss_x, ss_y);
  assert(plane_bsize < BLOCK_SIZES_ALL);
  const TX_SIZE max_tx_size = get_vartx_max_txsize(xd, plane_bsize, plane);
  const int step =
      tx_size_wide_unit[max_tx_size] * tx_size_high_unit[max_tx_size];
  const int bkw = tx_size_wide_unit[max_tx_size];
  const int bkh = tx_size_high_unit[max_tx_size];
  const BLOCK_SIZE max_unit_bsize =
      get_plane_block_size(BLOCK_64X64, ss_x, ss_y);
  const int num_4x4_w = mi_size_wide[plane_bsize];
  const int num_4x4_h = mi_size_high[plane_bsize];
  const int mu_blocks_wide = mi_size_wide[max_unit_bsize];
  const int mu_blocks_high = mi_size_high[max_unit_bsize];
  const int unit_height = AOMMIN(mu_blocks_high + (row >> ss_y), num_4x4_h);
  const int unit_width = AOMMIN(mu_blocks_wide + (col >> ss_x), num_4x4_w);
  for (int blk_row = row >> ss_y; blk_row < unit_height; blk_row += bkh) {
    for (int blk_col = col >> ss_x; blk_col < unit_width; blk_col += bkw) {
      pack_txb_tokens(w, cm, x, tok, tok_end, xd, mbmi, plane, plane_bsize,
                      cm->seq_params->bit_depth, *block, blk_row, blk_col,
                      max_tx_size, token_stats);
      *block += step;
    }
  }
}